

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_memory_storage.cpp
# Opt level: O2

bool __thiscall
cppcms::sessions::session_memory_storage::load
          (session_memory_storage *this,string *key,time_t *to,string *value)

{
  long lVar1;
  iterator pcVar2;
  time_t tVar3;
  bool bVar4;
  shared_lock<booster::shared_mutex> lock;
  shared_lock<booster::shared_mutex> local_30;
  
  local_30.m_ = &this->mutex_;
  booster::shared_mutex::shared_lock();
  pcVar2 = cppcms::impl::details::
           basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
           ::find<std::__cxx11::string>
                     ((basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
                       *)&this->map_,key);
  if (pcVar2 == (iterator)0x0) {
    bVar4 = false;
  }
  else {
    lVar1 = (pcVar2->val).second.timeout;
    bVar4 = false;
    tVar3 = time((time_t *)0x0);
    if (tVar3 <= lVar1) {
      std::__cxx11::string::_M_assign((string *)value);
      *to = (pcVar2->val).second.timeout;
      bVar4 = true;
    }
  }
  booster::shared_lock<booster::shared_mutex>::~shared_lock(&local_30);
  return bVar4;
}

Assistant:

bool load(std::string const &key,time_t &to,std::string &value)
	{
		booster::shared_lock<booster::shared_mutex> lock(mutex_);

		map_type::iterator p=map_.find(key);
		if(p==map_.end())
			return false;
		if(p->second.timeout < ::time(0))
			return false;
		value=p->second.info;
		to=p->second.timeout;
		return true;
	}